

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O2

void Abc_SclLibNormalizeSurface(SC_Surface *p,float Time,float Load)

{
  Vec_Flt_t *p_00;
  int iVar1;
  int i;
  float fVar2;
  
  for (iVar1 = 0; iVar1 < (p->vIndex0).nSize; iVar1 = iVar1 + 1) {
    fVar2 = Vec_FltEntry(&p->vIndex0,iVar1);
    Vec_FltWriteEntry(&p->vIndex0,iVar1,fVar2 * Time);
  }
  for (iVar1 = 0; iVar1 < (p->vIndex1).nSize; iVar1 = iVar1 + 1) {
    fVar2 = Vec_FltEntry(&p->vIndex1,iVar1);
    Vec_FltWriteEntry(&p->vIndex1,iVar1,fVar2 * Load);
  }
  for (iVar1 = 0; iVar1 < (p->vData).nSize; iVar1 = iVar1 + 1) {
    p_00 = (Vec_Flt_t *)Vec_PtrEntry(&p->vData,iVar1);
    for (i = 0; i < p_00->nSize; i = i + 1) {
      fVar2 = Vec_FltEntry(p_00,i);
      Vec_FltWriteEntry(p_00,i,fVar2 * Time);
    }
  }
  return;
}

Assistant:

void Abc_SclLibNormalizeSurface( SC_Surface * p, float Time, float Load )
{
    Vec_Flt_t * vArray;
    int i, k; float Entry;
    Vec_FltForEachEntry( &p->vIndex0, Entry, i ) // slew
        Vec_FltWriteEntry( &p->vIndex0, i, Time * Entry );
    Vec_FltForEachEntry( &p->vIndex1, Entry, i ) // load
        Vec_FltWriteEntry( &p->vIndex1, i, Load * Entry );
    Vec_PtrForEachEntry( Vec_Flt_t *, &p->vData, vArray, k )
        Vec_FltForEachEntry( vArray, Entry, i ) // delay/slew
            Vec_FltWriteEntry( vArray, i, Time * Entry );
}